

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

MaxHeap * __thiscall
hnsw::HNSWIndex::SearchLayer(HNSWIndex *this,float *q,Point *ep,uint32_t ef,uint32_t layer)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  reference pvVar4;
  float *pfVar5;
  undefined8 in_RDX;
  long in_RSI;
  MaxHeap *in_RDI;
  uint in_R8D;
  uint in_R9D;
  float fVar6;
  float dist;
  index_t *edge;
  Point *neighbor_1;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  Point *neighbor;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  Point p;
  MinHeap candidates;
  MaxHeap *result;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  const_reference in_stack_fffffffffffffee8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffef0;
  value_type *in_stack_fffffffffffffef8;
  uint *__args;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  float fVar7;
  undefined2 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0a;
  undefined1 in_stack_ffffffffffffff0b;
  undefined4 in_stack_ffffffffffffff0c;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_ffffffffffffff10;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_98;
  reference local_90;
  reference local_88;
  pair<unsigned_int,_float> *local_80;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_78;
  reference local_70;
  value_type local_68;
  byte local_29;
  uint local_28;
  uint local_24;
  undefined8 local_18;
  
  local_29 = 0;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_18 = in_RDX;
  MaxHeap::MaxHeap((MaxHeap *)0x11896e);
  MinHeap::MinHeap((MinHeap *)0x11897b);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (in_stack_fffffffffffffef0);
  MaxHeap::Container(in_RDI);
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  reserve(in_stack_ffffffffffffff10,
          CONCAT44(in_stack_ffffffffffffff0c,
                   CONCAT13(in_stack_ffffffffffffff0b,
                            CONCAT12(in_stack_ffffffffffffff0a,in_stack_ffffffffffffff08))));
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
             SUB41((uint)in_stack_fffffffffffffee4 >> 0x18,0));
  std::
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
  ::push((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
          *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8)
  ;
  std::
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  ::push((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
          *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8)
  ;
  while (bVar1 = std::
                 priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                 ::empty((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                          *)0x118a0e), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::
             priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
             ::top((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                    *)0x118a30);
    local_68 = *pvVar2;
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
    ::pop((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
           *)in_stack_fffffffffffffef0);
    fVar6 = local_68.second;
    pvVar3 = std::
             priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
             ::top((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                    *)0x118a6f);
    if (pvVar3->second < fVar6) break;
    pvVar4 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *
                        )(in_RSI + 0x30),(ulong)local_68 & 0xffffffff);
    local_70 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[](&pvVar4->neighbors,(ulong)local_28);
    local_78._M_current =
         (pair<unsigned_int,_float> *)
         std::
         vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
         begin(in_stack_fffffffffffffed8);
    local_80 = (pair<unsigned_int,_float> *)
               std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::end(in_stack_fffffffffffffed8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                               *)in_stack_fffffffffffffed8), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                 ::operator*(&local_78);
      bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (size_type)in_stack_fffffffffffffed8);
      if (!bVar1) {
        Matrix::operator[]((Matrix *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (size_t)in_stack_fffffffffffffed8);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
      ::operator++(&local_78);
    }
    pvVar4 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *
                        )(in_RSI + 0x30),(ulong)local_68 & 0xffffffff);
    local_90 = std::
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               ::operator[](&pvVar4->neighbors,(ulong)local_28);
    local_98._M_current =
         (pair<unsigned_int,_float> *)
         std::
         vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
         begin(in_stack_fffffffffffffed8);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    end(in_stack_fffffffffffffed8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (__normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                               *)in_stack_fffffffffffffed8), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
      ::operator*(&local_98);
      bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         (size_type)in_stack_fffffffffffffed8);
      fVar6 = in_stack_fffffffffffffee4;
      if (!bVar1) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8,
                   SUB41((uint)in_stack_fffffffffffffee4 >> 0x18,0));
        __args = *(uint **)(in_RSI + 0xb8);
        pfVar5 = Matrix::operator[]((Matrix *)
                                    CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                    (size_t)in_stack_fffffffffffffed8);
        fVar6 = (float)(*(code *)**(undefined8 **)__args)(__args,pfVar5,local_18);
        fVar7 = fVar6;
        in_stack_fffffffffffffef0 =
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::
             priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
             ::size((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                     *)0x118cf4);
        if ((in_stack_fffffffffffffef0 <
             (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(ulong)local_24) ||
           (in_stack_fffffffffffffee8 =
                 std::
                 priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                 ::top((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                        *)0x118d22), in_stack_fffffffffffffee4 = fVar6,
           fVar6 < in_stack_fffffffffffffee8->second)) {
          fVar6 = in_stack_fffffffffffffee4;
          std::
          priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
          ::emplace<unsigned_int_const&,float&>
                    ((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
                      *)CONCAT44(fVar7,in_stack_ffffffffffffff00),__args,
                     (float *)in_stack_fffffffffffffef0);
          std::
          priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
          ::emplace<unsigned_int_const&,float&>
                    ((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                      *)CONCAT44(fVar7,in_stack_ffffffffffffff00),__args,
                     (float *)in_stack_fffffffffffffef0);
          in_stack_fffffffffffffed8 =
               (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                *)std::
                  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                  ::size((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                          *)0x118d78);
          if ((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)(ulong)local_24 < in_stack_fffffffffffffed8) {
            std::
            priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
            ::pop((priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
                   *)in_stack_fffffffffffffef0);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
      ::operator++(&local_98);
      in_stack_fffffffffffffee4 = fVar6;
    }
  }
  local_29 = 1;
  MinHeap::~MinHeap((MinHeap *)0x118dcc);
  if ((local_29 & 1) == 0) {
    MaxHeap::~MaxHeap((MaxHeap *)0x118de0);
  }
  return in_RDI;
}

Assistant:

MaxHeap SearchLayer(const float *q, const Point &ep, uint32_t ef, uint32_t layer) {
    MaxHeap result;      // max heap
    MinHeap candidates;  // min heap
    visited_.reset();
    result.Container().reserve(ef);

    visited_.set(ep.first);
    candidates.push(ep);
    result.push(ep);

    while (!candidates.empty()) {
      Point p = candidates.top();
      candidates.pop();

      if (p.second > result.top().second) {
        break;
      }

#ifdef PREFETCH_DATA
      // prefetech into cache
      for (const Point &neighbor : vertices_[p.first].neighbors[layer]) {
        if (!visited_.test(neighbor.first)) {
          _mm_prefetch(points_[neighbor.first], _MM_HINT_T0);
        }
      }
#endif

      for (const Point &neighbor : vertices_[p.first].neighbors[layer]) {
        const index_t &edge = neighbor.first;
        if (visited_.test(neighbor.first)) {
          continue;
        }
        visited_.set(edge);
        float dist = distance_(points_[edge], q);
        if (result.size() < ef || dist < result.top().second) {
          candidates.emplace(edge, dist);
          result.emplace(edge, dist);
          if (result.size() > ef) {
            result.pop();
          }
        }
      }
    }

    return result;
  }